

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O0

void __thiscall
gui::DialogBox::setOptionButton(DialogBox *this,size_t index,shared_ptr<gui::Button> *button)

{
  bool bVar1;
  bool bVar2;
  shared_ptr<gui::Button> *psVar3;
  shared_ptr<gui::Button> *in_RSI;
  long *in_RDI;
  size_t i;
  bool foundButton;
  shared_ptr<gui::Button> *in_stack_ffffffffffffff28;
  shared_ptr<gui::Button> *in_stack_ffffffffffffff30;
  shared_ptr<gui::Button> *psVar4;
  shared_ptr<gui::Widget> *in_stack_ffffffffffffff40;
  ContainerBase *in_stack_ffffffffffffff48;
  vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
  *in_stack_ffffffffffffff50;
  shared_ptr<gui::Button> *local_78;
  DialogBox *in_stack_ffffffffffffffa0;
  vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_> local_48 [2];
  shared_ptr<gui::Button> *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::operator!=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    std::shared_ptr<gui::Widget>::shared_ptr<gui::Button,void>
              ((shared_ptr<gui::Widget> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bVar1 = ContainerBase::hasChild(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::shared_ptr<gui::Widget>::~shared_ptr((shared_ptr<gui::Widget> *)0x1947c3);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff50 = local_48;
      std::shared_ptr<gui::Widget>::shared_ptr<gui::Button,void>
                ((shared_ptr<gui::Widget> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      (**(code **)(*in_RDI + 0x10))(in_RDI,in_stack_ffffffffffffff50);
      std::shared_ptr<gui::Widget>::~shared_ptr((shared_ptr<gui::Widget> *)0x194809);
    }
    psVar4 = local_10;
    psVar3 = (shared_ptr<gui::Button> *)
             std::
             vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
             size((vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                   *)(in_RDI + 0x49));
    if (psVar3 <= psVar4) {
      std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
      resize(in_stack_ffffffffffffff50,(size_type)psVar4);
    }
    std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
    operator[]((vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                *)(in_RDI + 0x49),(size_type)local_10);
    std::shared_ptr<gui::Button>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else {
    psVar4 = local_10;
    psVar3 = (shared_ptr<gui::Button> *)
             std::
             vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
             size((vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                   *)(in_RDI + 0x49));
    if (psVar4 < psVar3) {
      std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
      operator[]((vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                  *)(in_RDI + 0x49),(size_type)local_10);
      std::shared_ptr<gui::Widget>::shared_ptr<gui::Button,void>
                ((shared_ptr<gui::Widget> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      ContainerBase::removeChild(in_stack_ffffffffffffff48,(shared_ptr<gui::Widget> *)psVar4);
      std::shared_ptr<gui::Widget>::~shared_ptr((shared_ptr<gui::Widget> *)0x194945);
      std::shared_ptr<gui::Button>::shared_ptr(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
      operator[]((vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                  *)(in_RDI + 0x49),(size_type)local_10);
      std::shared_ptr<gui::Button>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x194983);
      bVar1 = false;
      local_78 = local_10;
      while (psVar4 = local_78,
            psVar3 = (shared_ptr<gui::Button> *)
                     std::
                     vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                     ::size((vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                             *)(in_RDI + 0x49)), psVar4 < psVar3) {
        std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
        operator[]((vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                    *)(in_RDI + 0x49),(size_type)local_78);
        bVar2 = std::operator!=(psVar4,in_stack_ffffffffffffff28);
        if (bVar2) {
          bVar1 = true;
          break;
        }
        local_78 = (shared_ptr<gui::Button> *)
                   ((long)&(local_78->super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + 1);
      }
      if (!bVar1) {
        std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
        resize(in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      }
    }
  }
  updateButtons(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void DialogBox::setOptionButton(size_t index, std::shared_ptr<Button> button) {
    if (button != nullptr) {
        if (!hasChild(button)) {
            addChild(button);
        }
        if (index >= optionButtons_.size()) {
            optionButtons_.resize(index + 1);
        }
        optionButtons_[index] = button;
    } else if (index < optionButtons_.size()) {
        removeChild(optionButtons_[index]);
        optionButtons_[index] = nullptr;
        bool foundButton = false;
        for (size_t i = index; i < optionButtons_.size(); ++i) {
            if (optionButtons_[i] != nullptr) {
                foundButton = true;
                break;
            }
        }
        if (!foundButton) {
            optionButtons_.resize(index);
        }
    }
    updateButtons();
}